

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O0

void __thiscall KktCheck::printSol(KktCheck *this)

{
  _Setw _Var1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  long in_RDI;
  size_t i_2;
  size_t i_1;
  size_t i;
  char buff [10];
  ulong local_40;
  ulong local_30;
  ulong local_20;
  char local_12 [18];
  
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"Col value: ");
  local_20 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x168));
    if (sVar3 <= local_20) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x168),local_20);
    sprintf(local_12,"%2.2f ",*pvVar4);
    _Var1 = std::setw(5);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    std::operator<<(poVar2,local_12);
    local_20 = local_20 + 1;
  }
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"Col dual:  ");
  local_30 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180));
    if (sVar3 <= local_30) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x180),local_30);
    sprintf(local_12,"%2.2f ",*pvVar4);
    _Var1 = std::setw(5);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    std::operator<<(poVar2,local_12);
    local_30 = local_30 + 1;
  }
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar2,"Row dual:  ");
  local_40 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x198));
    if (sVar3 <= local_40) break;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x198),local_40);
    sprintf(local_12,"%2.2f ",*pvVar4);
    _Var1 = std::setw(5);
    poVar2 = std::operator<<((ostream *)&std::cout,_Var1);
    std::operator<<(poVar2,local_12);
    local_40 = local_40 + 1;
  }
  poVar2 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void KktCheck::printSol() {
	char buff [10];
	cout<<endl<<"Col value: ";
	for (size_t i=0;i<colValue.size();i++) {
		sprintf(buff, "%2.2f ", colValue[i]); 
		cout<<setw(5)<<buff; 
		}  
	cout<<endl<<"Col dual:  ";
	for (size_t i=0;i<colDual.size();i++) {
		sprintf(buff, "%2.2f ", colDual[i]);
		cout<<setw(5)<<buff; 
		}  
/*	cout<<endl<<"Row value: ";
	for (i=0;i<numRow;i++) {
	  	sprintf(buff, "%2.2f ", rowValue[i]);  
	  	cout<<setw(5)<<buff;
	  	}*/
	cout<<endl<<"Row dual:  ";
	for (size_t i=0;i<rowDual.size();i++) {
		sprintf(buff, "%2.2f ", rowDual[i]);  
		cout<<setw(5)<<buff; 
		}  
	cout<<endl<<endl;
}